

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk_interface_test.cc
# Opt level: O3

Test * anon_unknown.dwarf_e210f::DiskInterfaceTestStatExistingDir::Create(void)

{
  g_current_test = (Test *)operator_new(0x58);
  g_current_test->failed_ = false;
  g_current_test->assertion_failures_ = 0;
  g_current_test[1]._vptr_Test = (_func_int **)(g_current_test + 2);
  g_current_test[1].failed_ = false;
  *(undefined3 *)&g_current_test[1].field_0x9 = 0;
  g_current_test[1].assertion_failures_ = 0;
  *(undefined1 *)&g_current_test[2]._vptr_Test = 0;
  g_current_test[3]._vptr_Test = (_func_int **)(g_current_test + 4);
  g_current_test[3].failed_ = false;
  *(undefined3 *)&g_current_test[3].field_0x9 = 0;
  g_current_test[3].assertion_failures_ = 0;
  *(undefined1 *)&g_current_test[4]._vptr_Test = 0;
  g_current_test[5]._vptr_Test = (_func_int **)&PTR__FileReader_001d6c80;
  g_current_test->_vptr_Test = (_func_int **)&PTR__DiskInterfaceTest_001d2d78;
  return g_current_test;
}

Assistant:

TEST_F(DiskInterfaceTest, StatExistingDir) {
  string err;
  ASSERT_TRUE(disk_.MakeDir("subdir"));
  ASSERT_TRUE(disk_.MakeDir("subdir/subsubdir"));
  EXPECT_GT(disk_.Stat("..", &err), 1);
  EXPECT_EQ("", err);
  EXPECT_GT(disk_.Stat(".", &err), 1);
  EXPECT_EQ("", err);
  EXPECT_GT(disk_.Stat("subdir", &err), 1);
  EXPECT_EQ("", err);
  EXPECT_GT(disk_.Stat("subdir/subsubdir", &err), 1);
  EXPECT_EQ("", err);

  EXPECT_EQ(disk_.Stat("subdir", &err),
            disk_.Stat("subdir/.", &err));
  EXPECT_EQ(disk_.Stat("subdir", &err),
            disk_.Stat("subdir/subsubdir/..", &err));
  EXPECT_EQ(disk_.Stat("subdir/subsubdir", &err),
            disk_.Stat("subdir/subsubdir/.", &err));
}